

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  runtime_error *prVar4;
  streambuf *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810 [32];
  stringstream local_7f0 [8];
  stringstream targetContent;
  undefined1 local_7e0 [376];
  stringstream local_668 [8];
  stringstream sourceContent;
  undefined1 local_658 [383];
  undefined1 local_4d9;
  string local_4d8 [32];
  undefined1 local_4b8 [8];
  ifstream inTarget;
  string local_2a8 [32];
  undefined1 local_288 [8];
  ifstream inSource;
  JsonDocument local_80;
  allocator local_71;
  string local_70 [8];
  string targetPath;
  allocator local_49;
  string local_48 [8];
  string sourcePath;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Provide sufficient arguments");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar1,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = argv[2];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar1,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  json::JsonDocument::createFromFile(&local_80,(string *)local_48);
  json::JsonDocument::saveToFile(&local_80,(string *)local_70,4);
  json::JsonDocument::~JsonDocument(&local_80);
  std::ifstream::ifstream(local_288,local_48,8);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Could not open file: ");
    std::runtime_error::runtime_error(prVar4,local_2a8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(local_4b8,local_70,8);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    local_4d9 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_4d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Could not open file: ");
    std::runtime_error::runtime_error(prVar4,local_4d8);
    local_4d9 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_668);
  std::__cxx11::stringstream::stringstream(local_7f0);
  psVar5 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_658,psVar5);
  psVar5 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_7e0,psVar5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::str();
  bVar3 = std::operator!=(local_810,local_830);
  std::__cxx11::string::~string((string *)local_830);
  std::__cxx11::string::~string((string *)local_810);
  if (!bVar3) {
    std::ifstream::close();
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream(local_7f0);
    std::__cxx11::stringstream::~stringstream(local_668);
    std::ifstream::~ifstream(local_4b8);
    std::ifstream::~ifstream(local_288);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_48);
    return 0;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"The two files were not equal");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char **argv)
{
    if (argc < 2)
        throw std::runtime_error("Provide sufficient arguments");

    // The file to parse.
    std::string sourcePath = argv[1];

    // The file we want to write to.
    std::string targetPath = argv[2];

    // Parse the source file and save it to the target file.
    JsonDocument::createFromFile(sourcePath).saveToFile(targetPath);

    std::ifstream inSource(sourcePath);

    if (!inSource.is_open())
        throw std::runtime_error("Could not open file: " + sourcePath);

    std::ifstream inTarget(targetPath);

    if (!inTarget.is_open())
        throw std::runtime_error("Could not open file: " + targetPath);

    std::stringstream sourceContent;
    std::stringstream targetContent;

    // Read the two files.
    sourceContent << inSource.rdbuf();
    targetContent << inTarget.rdbuf();

    // Compare the two files, if the parser works they should be equal.
    if (sourceContent.str() != targetContent.str())
        throw std::runtime_error("The two files were not equal");

    inSource.close();
    inTarget.close();
}